

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void partial_suite::format_boolean(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined2 local_c8;
  undefined1 local_c6;
  undefined1 local_c5 [5];
  value_type expected [3];
  undefined1 local_b8 [8];
  writer writer;
  undefined1 local_50 [8];
  buffer_type_conflict result;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)local_b8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  trial::protocol::bintoken::basic_writer<16UL>::
  value<trial::protocol::bintoken::token::begin_record>((basic_writer<16UL> *)local_b8);
  trial::protocol::bintoken::partial::format<std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)
             &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(writer *)local_b8);
  trial::protocol::bintoken::basic_writer<16UL>::value<trial::protocol::bintoken::token::end_record>
            ((basic_writer<16UL> *)local_b8);
  local_c6 = 0x91;
  local_c8 = 0x8190;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x1d1,"void partial_suite::format_boolean()",iVar1._M_current,iVar2._M_current,
             &local_c8,local_c5);
  trial::protocol::bintoken::basic_writer<16UL>::~basic_writer((basic_writer<16UL> *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void format_boolean()
{
    variable data(true);
    buffer_type result;
    bintoken::writer writer(result);
    writer.value<bintoken::token::begin_record>();
    bintoken::partial::format(data, writer);
    writer.value<bintoken::token::end_record>();
    const value_type expected[] = {
        bintoken::token::code::begin_record,
        bintoken::token::code::true_value,
        bintoken::token::code::end_record
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}